

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Split
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out1,uint32_t startXOut1,
               uint32_t startYOut1,Image *out2,uint32_t startXOut2,uint32_t startYOut2,Image *out3,
               uint32_t startXOut3,uint32_t startYOut3,uint32_t width,uint32_t height)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  uchar *puVar11;
  long lVar12;
  ulong uVar13;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,width,height);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out1,startXOut1,startYOut1,out2,startXOut2,startYOut2,out3,startXOut3,startYOut3,width,
             height);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,out3);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (out1,&local_58,&local_80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  uVar2 = out1->_rowSize;
  uVar3 = in->_rowSize;
  uVar4 = out3->_rowSize;
  puVar8 = out1->_data + (ulong)startXOut1 + (ulong)(startYOut1 * uVar2);
  uVar5 = out2->_rowSize;
  puVar6 = in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * uVar3);
  puVar10 = out3->_data + (ulong)startXOut3 + (ulong)(startYOut3 * uVar4);
  puVar7 = puVar6 + height * uVar3;
  puVar9 = out2->_data + (ulong)startXOut2 + (ulong)(startYOut2 * uVar5);
  for (; puVar6 != puVar7; puVar6 = puVar6 + uVar3) {
    lVar12 = 0;
    puVar11 = puVar6;
    for (uVar13 = (ulong)(width * 3); uVar13 != 0; uVar13 = uVar13 - 3) {
      puVar8[lVar12] = *puVar11;
      puVar9[lVar12] = puVar11[1];
      puVar1 = puVar11 + 2;
      puVar11 = puVar11 + 3;
      puVar10[lVar12] = *puVar1;
      lVar12 = lVar12 + 1;
    }
    puVar8 = puVar8 + uVar2;
    puVar9 = puVar9 + uVar5;
    puVar10 = puVar10 + uVar4;
  }
  return;
}

Assistant:

void Split( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out1, uint32_t startXOut1, uint32_t startYOut1,
                Image & out2, uint32_t startXOut2, uint32_t startYOut2, Image & out3, uint32_t startXOut3, uint32_t startYOut3,
                uint32_t width, uint32_t height )
    {
        ParameterValidation ( in, startXIn, startYIn, width, height );
        ParameterValidation ( out1, startXOut1, startYOut1, out2, startXOut2, startYOut2, out3, startXOut3, startYOut3, width, height );
        VerifyRGBImage      ( in );
        VerifyGrayScaleImage( out1, out2, out3 );

        const uint8_t colorCount = RGB;

        const uint32_t rowSizeIn   = in.rowSize();
        const uint32_t rowSizeOut1 = out1.rowSize();
        const uint32_t rowSizeOut2 = out2.rowSize();
        const uint32_t rowSizeOut3 = out3.rowSize();

        width = width * colorCount;

        const uint8_t * inY = in.data() + startYIn * rowSizeIn + startXIn * colorCount;
        uint8_t * out1Y = out1.data() + startYOut1 * rowSizeOut1 + startXOut1;
        uint8_t * out2Y = out2.data() + startYOut2 * rowSizeOut2 + startXOut2;
        uint8_t * out3Y = out3.data() + startYOut3 * rowSizeOut3 + startXOut3;

        const uint8_t * inYEnd = inY + height * rowSizeIn;

        for( ; inY != inYEnd; inY += rowSizeIn, out1Y += rowSizeOut1, out2Y += rowSizeOut2, out3Y += rowSizeOut3 ) {
            const uint8_t * inX = inY;
            uint8_t * out1X = out1Y;
            uint8_t * out2X = out2Y;
            uint8_t * out3X = out3Y;

            const uint8_t * inXEnd = inX + width;

            for( ; inX != inXEnd; ) {
                *(out1X++) = *(inX++);
                *(out2X++) = *(inX++);
                *(out3X++) = *(inX++);
            }
        }
    }